

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx::create_group_ops(ConvolutionDepthWise_x86_avx *this,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  int *piVar6;
  long *plVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  size_t sVar11;
  int i;
  uint uVar12;
  pointer ppLVar13;
  Layer *pLVar14;
  pointer ppLVar15;
  ulong uVar16;
  size_t sVar17;
  void *pvVar18;
  Allocator *pAVar19;
  int iVar20;
  void *in_R8;
  Allocator *pAVar21;
  long lVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [32];
  undefined1 auVar27 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar39 [16];
  undefined1 in_ZMM11 [64];
  ParamDict pd;
  Mat local_2a8;
  undefined8 local_260;
  int local_254;
  uint local_250;
  int local_24c;
  Mat local_248;
  Allocator *local_200;
  int *piStack_1f8;
  size_t local_1f0;
  uint local_1e8;
  Allocator *local_1e0;
  undefined8 local_1d8;
  ulong uStack_1d0;
  uint local_1c8;
  size_t local_1c0;
  Allocator *local_1b8;
  int *piStack_1b0;
  size_t local_1a8;
  uint local_1a0;
  Allocator *local_198;
  undefined8 local_190;
  undefined8 uStack_188;
  uint local_180;
  size_t local_178;
  void *local_170;
  int *piStack_168;
  size_t sStack_160;
  int iStack_158;
  Allocator *local_150;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined4 local_138;
  undefined8 local_130;
  void *local_128;
  int *piStack_120;
  size_t sStack_118;
  int iStack_110;
  Allocator *local_108;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 local_f0;
  undefined8 local_e8;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_e0;
  size_t local_d8;
  Allocator *local_d0;
  Mat local_c8;
  size_t local_78;
  Mat *local_70;
  size_t local_68;
  Option *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  ParamDict local_40;
  
  iVar2 = (this->super_ConvolutionDepthWise).num_output;
  iVar20 = (this->super_ConvolutionDepthWise).kernel_h * (this->super_ConvolutionDepthWise).kernel_w
  ;
  iVar3 = (this->super_ConvolutionDepthWise).group;
  uVar16 = (long)(this->super_ConvolutionDepthWise).weight_data_size / (long)iVar3;
  uVar16 = (long)((ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar16 & 0xffffffff) / (long)iVar20;
  ppLVar15 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  ppLVar13 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_60 = opt;
  if (0 < (int)((ulong)((long)ppLVar15 - (long)ppLVar13) >> 3)) {
    lVar22 = 0;
    do {
      if (ppLVar13[lVar22] != (Layer *)0x0) {
        (*ppLVar13[lVar22]->_vptr_Layer[1])();
        ppLVar13 = (this->group_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppLVar15 = (this->group_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 < (int)((ulong)((long)ppLVar15 - (long)ppLVar13) >> 3));
  }
  local_e0 = &this->group_ops;
  if (ppLVar15 != ppLVar13) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar13;
  }
  iVar4 = (this->super_ConvolutionDepthWise).group;
  i = (this->super_ConvolutionDepthWise).num_output / iVar4;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_e0,(long)iVar4);
  if (0 < (this->super_ConvolutionDepthWise).group) {
    local_24c = iVar20 * i *
                (((int)((long)((ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar16 & 0xffffffff) /
                       (long)(iVar2 / iVar3)) * iVar3) / iVar4);
    local_68 = (size_t)local_24c;
    local_78 = (size_t)i;
    local_70 = &(this->super_ConvolutionDepthWise).activation_params;
    sVar17 = 0;
    local_58 = 0x8000000000000000;
    uStack_50 = 0x8000000000000000;
    do {
      auVar39 = in_ZMM11._0_16_;
      auVar38 = in_ZMM10._0_16_;
      local_248.elemsize = (this->super_ConvolutionDepthWise).weight_data.elemsize;
      local_248.data =
           (void *)(sVar17 * local_68 * local_248.elemsize +
                   (long)(this->super_ConvolutionDepthWise).weight_data.data);
      local_248.elempack = (this->super_ConvolutionDepthWise).weight_data.elempack;
      local_248.allocator = (this->super_ConvolutionDepthWise).weight_data.allocator;
      local_248.refcount = (int *)0x0;
      local_248.w = (int)local_68;
      local_248.dims = 1;
      local_248.h = 1;
      local_248.d = 1;
      local_248.c = 1;
      local_248.cstep = local_68;
      Mat::clone(&local_c8,(__fn *)&local_248,(void *)0x0,1,in_R8);
      if (local_248.refcount != (int *)0x0) {
        LOCK();
        *local_248.refcount = *local_248.refcount + -1;
        UNLOCK();
        if (*local_248.refcount == 0) {
          if (local_248.allocator == (Allocator *)0x0) {
            if (local_248.data != (void *)0x0) {
              free(local_248.data);
            }
          }
          else {
            (*(local_248.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      bVar23 = (this->super_ConvolutionDepthWise).bias_term == 0;
      if (bVar23) {
        pAVar21 = (Allocator *)0x0;
        local_260 = 0;
        local_250 = 0;
        local_d0 = (Allocator *)0x0;
        local_254 = 0;
        local_d8 = 0;
      }
      else {
        local_260 = (this->super_ConvolutionDepthWise).bias_data.elemsize;
        pAVar21 = (Allocator *)
                  (sVar17 * local_78 * local_260 +
                  (long)(this->super_ConvolutionDepthWise).bias_data.data);
        local_250 = (this->super_ConvolutionDepthWise).bias_data.elempack;
        local_d0 = (this->super_ConvolutionDepthWise).bias_data.allocator;
        local_d8 = local_78;
        local_254 = i;
      }
      bVar23 = !bVar23;
      pLVar14 = create_layer_cpu(6);
      ParamDict::ParamDict(&local_40);
      ParamDict::set(&local_40,0,i);
      ParamDict::set(&local_40,1,(this->super_ConvolutionDepthWise).kernel_w);
      ParamDict::set(&local_40,0xb,(this->super_ConvolutionDepthWise).kernel_h);
      ParamDict::set(&local_40,2,(this->super_ConvolutionDepthWise).dilation_w);
      ParamDict::set(&local_40,0xc,(this->super_ConvolutionDepthWise).dilation_h);
      ParamDict::set(&local_40,3,(this->super_ConvolutionDepthWise).stride_w);
      ParamDict::set(&local_40,0xd,(this->super_ConvolutionDepthWise).stride_h);
      ParamDict::set(&local_40,4,0);
      ParamDict::set(&local_40,0xe,0);
      ParamDict::set(&local_40,5,(this->super_ConvolutionDepthWise).bias_term);
      ParamDict::set(&local_40,6,local_24c);
      ParamDict::set(&local_40,8,(this->super_ConvolutionDepthWise).int8_scale_term);
      ParamDict::set(&local_40,9,(this->super_ConvolutionDepthWise).activation_type);
      ParamDict::set(&local_40,10,local_70);
      (*pLVar14->_vptr_Layer[2])(pLVar14,&local_40);
      if ((this->super_ConvolutionDepthWise).bias_term == 0) {
        lVar22 = 0x40;
        auVar25._0_12_ = ZEXT812(0);
        auVar25._12_4_ = 0;
        do {
          *(undefined8 *)((long)&local_248.data + lVar22) = 0;
          *(undefined1 (*) [16])((long)&local_2a8.allocator + lVar22) = auVar25;
          *(undefined1 (*) [16])((long)&local_2a8.w + lVar22) = auVar25;
          *(undefined1 (*) [16])((long)&local_2a8.cstep + lVar22) = auVar25;
          *(undefined1 (*) [16])((long)&local_260 + lVar22 + 4) = auVar25;
          lVar22 = lVar22 + 0x48;
        } while (lVar22 != 0x160);
        if (local_c8.refcount != (int *)0x0) {
          LOCK();
          *local_c8.refcount = *local_c8.refcount + 1;
          UNLOCK();
        }
        if (local_248.refcount != (int *)0x0) {
          LOCK();
          *local_248.refcount = *local_248.refcount + -1;
          UNLOCK();
          if (*local_248.refcount == 0) {
            if (local_248.allocator == (Allocator *)0x0) {
              if (local_248.data != (void *)0x0) {
                free(local_248.data);
              }
            }
            else {
              (*(local_248.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_248.data = local_c8.data;
        local_248.refcount = local_c8.refcount;
        local_248.elemsize = local_c8.elemsize;
        local_248.elempack = local_c8.elempack;
        local_248.allocator = local_c8.allocator;
        local_248.dims = local_c8.dims;
        local_248.w = local_c8.w;
        local_248.h = local_c8.h;
        local_248.d = local_c8.d;
        local_248.c = local_c8.c;
        local_248.cstep = local_c8.cstep;
        if ((this->super_ConvolutionDepthWise).int8_scale_term != 0) {
          local_2a8.cstep = 0;
          local_2a8.data = (Allocator *)0x0;
          local_2a8.refcount._0_4_ = 0;
          local_2a8.refcount._4_4_ = 0;
          local_2a8.elemsize._0_4_ = 0;
          local_2a8.elempack = 0;
          local_2a8.elemsize._4_4_ = (int)local_2a8.refcount;
          local_2a8.allocator = (Allocator *)local_2a8.data;
          local_2a8.dims = (int)local_2a8.refcount;
          local_2a8.w = local_2a8.elempack;
          local_2a8.h = (int)local_2a8.elemsize;
          local_2a8.d = (int)local_2a8.refcount;
          local_2a8.c = local_2a8.elempack;
          Mat::create(&local_2a8,i,4,(Allocator *)0x0);
          auVar10 = _DAT_005a48a0;
          auVar9 = _DAT_005a4880;
          uVar12 = local_2a8.c * (int)local_2a8.cstep;
          auVar8._8_8_ = uStack_50;
          auVar8._0_8_ = local_58;
          auVar38 = vpcmpeqd_avx(auVar38,auVar38);
          if (0 < (int)uVar12) {
            auVar27._8_8_ = 0;
            auVar27._0_8_ = (ulong)uVar12 - 1;
            auVar25 = vpshufd_avx(auVar27,0x44);
            uVar1 = *(undefined4 *)
                     ((long)(this->super_ConvolutionDepthWise).weight_data_int8_scales.data +
                     sVar17 * 4);
            auVar29._4_4_ = uVar1;
            auVar29._0_4_ = uVar1;
            auVar29._8_4_ = uVar1;
            auVar29._12_4_ = uVar1;
            auVar29._16_4_ = uVar1;
            auVar29._20_4_ = uVar1;
            auVar29._24_4_ = uVar1;
            auVar29._28_4_ = uVar1;
            uVar16 = 0;
            do {
              auVar31._8_8_ = 0;
              auVar31._0_8_ = uVar16;
              auVar27 = vpshufd_avx(auVar31,0x44);
              auVar34._16_16_ = auVar27;
              auVar34._0_16_ = auVar27;
              auVar35 = vorps_avx(auVar34,auVar9);
              auVar34 = vorps_avx(auVar10,auVar34);
              auVar27 = vpcmpgtq_avx(auVar8 ^ auVar34._16_16_,auVar8 ^ auVar25);
              auVar31 = vpcmpgtq_avx(auVar8 ^ auVar34._0_16_,auVar8 ^ auVar25);
              auVar27 = vpackssdw_avx(auVar31,auVar27);
              auVar31 = vpcmpgtq_avx(auVar8 ^ auVar35._16_16_,auVar8 ^ auVar25);
              auVar37._0_4_ = (uint)local_58 ^ auVar35._0_4_;
              auVar37._4_4_ = (uint)((ulong)local_58 >> 0x20) ^ auVar35._4_4_;
              auVar37._8_4_ = (uint)uStack_50 ^ auVar35._8_4_;
              auVar37._12_4_ = (uint)((ulong)uStack_50 >> 0x20) ^ auVar35._12_4_;
              auVar37 = vpcmpgtq_avx(auVar37,auVar8 ^ auVar25);
              auVar31 = vpackssdw_avx(auVar37,auVar31);
              auVar27 = vpackssdw_avx(auVar38 ^ auVar31,auVar38 ^ auVar27);
              auVar31 = vpmovsxwd_avx(auVar27);
              auVar27 = vpunpckhwd_avx(auVar27,auVar27);
              auVar35._16_16_ = auVar27;
              auVar35._0_16_ = auVar31;
              auVar35 = vmaskmovps_avx(auVar35,auVar29);
              *(undefined1 (*) [32])((long)(_func_int ***)local_2a8.data + uVar16 * 4) = auVar35;
              uVar16 = uVar16 + 8;
            } while ((uVar12 + 7 & 0xfffffff8) != uVar16);
          }
          piVar6 = (int *)CONCAT44(local_2a8.refcount._4_4_,(int)local_2a8.refcount);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          if (piStack_1f8 != (int *)0x0) {
            LOCK();
            *piStack_1f8 = *piStack_1f8 + -1;
            UNLOCK();
            if (*piStack_1f8 == 0) {
              if (local_1e0 == (Allocator *)0x0) {
                if (local_200 != (Allocator *)0x0) {
                  free(local_200);
                }
              }
              else {
                (*local_1e0->_vptr_Allocator[3])();
              }
            }
          }
          piStack_1f8 = (int *)CONCAT44(local_2a8.refcount._4_4_,(int)local_2a8.refcount);
          local_200 = (Allocator *)local_2a8.data;
          local_1f0 = CONCAT44(local_2a8.elemsize._4_4_,(int)local_2a8.elemsize);
          local_1e8 = local_2a8.elempack;
          local_1e0 = local_2a8.allocator;
          local_1d8 = CONCAT44(local_2a8.w,local_2a8.dims);
          uStack_1d0 = CONCAT44(local_2a8.d,local_2a8.h);
          local_1c8 = local_2a8.c;
          local_1c0 = local_2a8.cstep;
          sVar5 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elemsize;
          pAVar19 = (Allocator *)
                    (sVar5 * sVar17 +
                    (long)(this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data);
          uVar12 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elempack;
          pAVar21 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.allocator;
          local_260 = sVar17;
          if (piStack_1b0 != (int *)0x0) {
            LOCK();
            *piStack_1b0 = *piStack_1b0 + -1;
            UNLOCK();
            if (*piStack_1b0 == 0) {
              if (local_198 == (Allocator *)0x0) {
                if (local_1b8 != (Allocator *)0x0) {
                  free(local_1b8);
                }
              }
              else {
                (*local_198->_vptr_Allocator[3])();
              }
            }
          }
          sVar11 = local_260;
          piStack_1b0 = (int *)0x0;
          local_190 = 0x100000001;
          uStack_188 = 0x100000001;
          local_180 = 1;
          local_178 = 1;
          piVar6 = (int *)CONCAT44(local_2a8.refcount._4_4_,(int)local_2a8.refcount);
          local_1b8 = pAVar19;
          local_1a8 = sVar5;
          local_1a0 = uVar12;
          local_198 = pAVar21;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_2a8.allocator == (Allocator *)0x0) {
                if ((Allocator *)local_2a8.data != (Allocator *)0x0) {
                  free(local_2a8.data);
                }
              }
              else {
                (*(local_2a8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          sVar17 = sVar11;
          if (100 < (this->super_ConvolutionDepthWise).int8_scale_term) {
            sVar5 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elemsize;
            pvVar18 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.data;
            iVar2 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elempack;
            pAVar21 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.allocator;
            if (piStack_168 != (int *)0x0) {
              LOCK();
              *piStack_168 = *piStack_168 + -1;
              UNLOCK();
              if (*piStack_168 == 0) {
                if (local_150 == (Allocator *)0x0) {
                  if (local_170 != (void *)0x0) {
                    free(local_170);
                  }
                }
                else {
                  (*local_150->_vptr_Allocator[3])();
                }
              }
            }
            piStack_168 = (int *)0x0;
            local_148 = 1;
            uStack_144 = 1;
            uStack_140 = 1;
            uStack_13c = 1;
            local_138 = 1;
            local_130 = 1;
            sVar17 = local_260;
            local_170 = (void *)(sVar5 * sVar11 + (long)pvVar18);
            sStack_160 = sVar5;
            iStack_158 = iVar2;
            local_150 = pAVar21;
          }
        }
        in_ZMM10 = ZEXT1664(auVar38);
        in_ZMM11 = ZEXT1664(auVar39);
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_2a8,&local_248);
        (*pLVar14->_vptr_Layer[3])(pLVar14,&local_2a8);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_2a8);
        lVar22 = 0xd8;
        do {
          piVar6 = *(int **)((long)&local_248.refcount + lVar22);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              pvVar18 = *(void **)((long)&local_248.data + lVar22);
              plVar7 = *(long **)((long)&local_248.allocator + lVar22);
              if (plVar7 == (long *)0x0) {
                if (pvVar18 != (void *)0x0) {
                  free(pvVar18);
                }
              }
              else {
                (**(code **)(*plVar7 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_248.cstep + lVar22) = 0;
          *(undefined8 *)((long)&local_248.refcount + lVar22 + 4) = 0;
          *(undefined8 *)((long)&local_248.elemsize + lVar22 + 4) = 0;
          *(undefined8 *)((long)&local_248.data + lVar22) = 0;
          *(undefined8 *)((long)&local_248.refcount + lVar22) = 0;
          *(undefined8 *)((long)&local_248.dims + lVar22) = 0;
          *(undefined8 *)((long)&local_248.h + lVar22) = 0;
          *(undefined4 *)((long)&local_248.c + lVar22) = 0;
          lVar22 = lVar22 + -0x48;
        } while (lVar22 != -0x48);
      }
      else {
        lVar22 = 0x40;
        auVar24._0_12_ = ZEXT812(0);
        auVar24._12_4_ = 0;
        do {
          *(undefined8 *)((long)&local_248.data + lVar22) = 0;
          *(undefined1 (*) [16])((long)&local_2a8.allocator + lVar22) = auVar24;
          *(undefined1 (*) [16])((long)&local_2a8.w + lVar22) = auVar24;
          *(undefined1 (*) [16])((long)&local_2a8.cstep + lVar22) = auVar24;
          *(undefined1 (*) [16])((long)&local_260 + lVar22 + 4) = auVar24;
          lVar22 = lVar22 + 0x48;
        } while (lVar22 != 0x1a8);
        if (local_c8.refcount != (int *)0x0) {
          LOCK();
          *local_c8.refcount = *local_c8.refcount + 1;
          UNLOCK();
        }
        if (local_248.refcount != (int *)0x0) {
          LOCK();
          *local_248.refcount = *local_248.refcount + -1;
          UNLOCK();
          if (*local_248.refcount == 0) {
            if (local_248.allocator == (Allocator *)0x0) {
              if (local_248.data != (void *)0x0) {
                free(local_248.data);
              }
            }
            else {
              (*(local_248.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_248.data = local_c8.data;
        local_248.refcount = local_c8.refcount;
        local_248.elemsize = local_c8.elemsize;
        local_248.elempack = local_c8.elempack;
        local_248.allocator = local_c8.allocator;
        local_248.dims = local_c8.dims;
        local_248.w = local_c8.w;
        local_248.h = local_c8.h;
        local_248.d = local_c8.d;
        local_248.c = local_c8.c;
        local_248.cstep = local_c8.cstep;
        if (piStack_1f8 != (int *)0x0) {
          LOCK();
          *piStack_1f8 = *piStack_1f8 + -1;
          UNLOCK();
          if (*piStack_1f8 == 0) {
            if (local_1e0 == (Allocator *)0x0) {
              if (local_200 != (Allocator *)0x0) {
                free(local_200);
              }
            }
            else {
              (*local_1e0->_vptr_Allocator[3])();
            }
          }
        }
        piStack_1f8 = (int *)0x0;
        local_1f0 = local_260;
        local_1e8 = local_250;
        local_1e0 = local_d0;
        local_1c8 = (uint)bVar23;
        local_1d8 = CONCAT44(local_254,local_1c8);
        uStack_1d0 = (ulong)CONCAT14(bVar23,local_1c8);
        local_1c0 = local_d8;
        local_200 = pAVar21;
        if ((this->super_ConvolutionDepthWise).int8_scale_term != 0) {
          local_2a8.cstep = 0;
          local_2a8.data = (Allocator *)0x0;
          local_2a8.refcount._0_4_ = 0;
          local_2a8.refcount._4_4_ = 0;
          local_2a8.elemsize._0_4_ = 0;
          local_2a8.elemsize._4_4_ = 0;
          local_2a8.elempack = 0;
          local_2a8.h = 0;
          local_2a8.d = 0;
          local_2a8.c = 0;
          local_2a8.allocator = (Allocator *)0x0;
          local_2a8.dims = 0;
          local_2a8.w = 0;
          Mat::create(&local_2a8,i,4,(Allocator *)0x0);
          auVar10 = _DAT_005a48a0;
          auVar9 = _DAT_005a4880;
          uVar12 = local_2a8.c * (int)local_2a8.cstep;
          auVar38._8_8_ = uStack_50;
          auVar38._0_8_ = local_58;
          auVar39 = vpcmpeqd_avx(auVar39,auVar39);
          if (0 < (int)uVar12) {
            auVar26._8_8_ = 0;
            auVar26._0_8_ = (ulong)uVar12 - 1;
            auVar25 = vpshufd_avx(auVar26,0x44);
            uVar1 = *(undefined4 *)
                     ((long)(this->super_ConvolutionDepthWise).weight_data_int8_scales.data +
                     sVar17 * 4);
            auVar28._4_4_ = uVar1;
            auVar28._0_4_ = uVar1;
            auVar28._8_4_ = uVar1;
            auVar28._12_4_ = uVar1;
            auVar28._16_4_ = uVar1;
            auVar28._20_4_ = uVar1;
            auVar28._24_4_ = uVar1;
            auVar28._28_4_ = uVar1;
            uVar16 = 0;
            do {
              auVar30._8_8_ = 0;
              auVar30._0_8_ = uVar16;
              auVar8 = vpshufd_avx(auVar30,0x44);
              auVar32._16_16_ = auVar8;
              auVar32._0_16_ = auVar8;
              auVar29 = vorps_avx(auVar9,auVar32);
              auVar35 = vorps_avx(auVar10,auVar32);
              auVar8 = vpcmpgtq_avx(auVar38 ^ auVar35._16_16_,auVar38 ^ auVar25);
              auVar27 = vpcmpgtq_avx(auVar38 ^ auVar35._0_16_,auVar38 ^ auVar25);
              auVar8 = vpackssdw_avx(auVar27,auVar8);
              auVar27 = vpcmpgtq_avx(auVar38 ^ auVar29._16_16_,auVar38 ^ auVar25);
              auVar36._0_4_ = (uint)local_58 ^ auVar29._0_4_;
              auVar36._4_4_ = (uint)((ulong)local_58 >> 0x20) ^ auVar29._4_4_;
              auVar36._8_4_ = (uint)uStack_50 ^ auVar29._8_4_;
              auVar36._12_4_ = (uint)((ulong)uStack_50 >> 0x20) ^ auVar29._12_4_;
              auVar31 = vpcmpgtq_avx(auVar36,auVar38 ^ auVar25);
              auVar27 = vpackssdw_avx(auVar31,auVar27);
              auVar8 = vpackssdw_avx(auVar39 ^ auVar27,auVar39 ^ auVar8);
              auVar27 = vpmovsxwd_avx(auVar8);
              auVar8 = vpunpckhwd_avx(auVar8,auVar8);
              auVar33._16_16_ = auVar8;
              auVar33._0_16_ = auVar27;
              auVar29 = vmaskmovps_avx(auVar33,auVar28);
              *(undefined1 (*) [32])((long)(_func_int ***)local_2a8.data + uVar16 * 4) = auVar29;
              uVar16 = uVar16 + 8;
            } while ((uVar12 + 7 & 0xfffffff8) != uVar16);
          }
          piVar6 = (int *)CONCAT44(local_2a8.refcount._4_4_,(int)local_2a8.refcount);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          if (piStack_1b0 != (int *)0x0) {
            LOCK();
            *piStack_1b0 = *piStack_1b0 + -1;
            UNLOCK();
            if (*piStack_1b0 == 0) {
              if (local_198 == (Allocator *)0x0) {
                if (local_1b8 != (Allocator *)0x0) {
                  free(local_1b8);
                }
              }
              else {
                (*local_198->_vptr_Allocator[3])();
              }
            }
          }
          piStack_1b0 = (int *)CONCAT44(local_2a8.refcount._4_4_,(int)local_2a8.refcount);
          local_1b8 = (Allocator *)local_2a8.data;
          local_1a8 = CONCAT44(local_2a8.elemsize._4_4_,(int)local_2a8.elemsize);
          local_1a0 = local_2a8.elempack;
          local_198 = local_2a8.allocator;
          local_190 = CONCAT44(local_2a8.w,local_2a8.dims);
          uStack_188 = CONCAT44(local_2a8.d,local_2a8.h);
          local_180 = local_2a8.c;
          local_178 = local_2a8.cstep;
          sVar5 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elemsize;
          pvVar18 = (void *)(sVar5 * sVar17 +
                            (long)(this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data);
          iVar2 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elempack;
          pAVar21 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.allocator;
          local_260 = sVar17;
          if (piStack_168 != (int *)0x0) {
            LOCK();
            *piStack_168 = *piStack_168 + -1;
            UNLOCK();
            if (*piStack_168 == 0) {
              if (local_150 == (Allocator *)0x0) {
                if (local_170 != (void *)0x0) {
                  free(local_170);
                }
              }
              else {
                (*local_150->_vptr_Allocator[3])();
              }
            }
          }
          sVar11 = local_260;
          piStack_168 = (int *)0x0;
          local_148 = 1;
          uStack_144 = 1;
          uStack_140 = 1;
          uStack_13c = 1;
          local_138 = 1;
          local_130 = 1;
          piVar6 = (int *)CONCAT44(local_2a8.refcount._4_4_,(int)local_2a8.refcount);
          local_170 = pvVar18;
          sStack_160 = sVar5;
          iStack_158 = iVar2;
          local_150 = pAVar21;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_2a8.allocator == (Allocator *)0x0) {
                if ((Allocator *)local_2a8.data != (Allocator *)0x0) {
                  free(local_2a8.data);
                }
              }
              else {
                (*(local_2a8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          sVar17 = sVar11;
          if (100 < (this->super_ConvolutionDepthWise).int8_scale_term) {
            sVar5 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elemsize;
            pvVar18 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.data;
            iVar2 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elempack;
            pAVar21 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.allocator;
            if (piStack_120 != (int *)0x0) {
              LOCK();
              *piStack_120 = *piStack_120 + -1;
              UNLOCK();
              if (*piStack_120 == 0) {
                if (local_108 == (Allocator *)0x0) {
                  if (local_128 != (void *)0x0) {
                    free(local_128);
                  }
                }
                else {
                  (*local_108->_vptr_Allocator[3])();
                }
              }
            }
            piStack_120 = (int *)0x0;
            local_100 = 1;
            uStack_fc = 1;
            uStack_f8 = 1;
            uStack_f4 = 1;
            local_f0 = 1;
            local_e8 = 1;
            sVar17 = local_260;
            local_128 = (void *)(sVar5 * sVar11 + (long)pvVar18);
            sStack_118 = sVar5;
            iStack_110 = iVar2;
            local_108 = pAVar21;
          }
        }
        in_ZMM10 = ZEXT1664(auVar38);
        in_ZMM11 = ZEXT1664(auVar39);
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_2a8,&local_248);
        (*pLVar14->_vptr_Layer[3])(pLVar14,&local_2a8);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_2a8);
        lVar22 = 0x120;
        do {
          piVar6 = *(int **)((long)&local_248.refcount + lVar22);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              pvVar18 = *(void **)((long)&local_248.data + lVar22);
              plVar7 = *(long **)((long)&local_248.allocator + lVar22);
              if (plVar7 == (long *)0x0) {
                if (pvVar18 != (void *)0x0) {
                  free(pvVar18);
                }
              }
              else {
                (**(code **)(*plVar7 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_248.cstep + lVar22) = 0;
          *(undefined8 *)((long)&local_248.refcount + lVar22 + 4) = 0;
          *(undefined8 *)((long)&local_248.elemsize + lVar22 + 4) = 0;
          *(undefined8 *)((long)&local_248.data + lVar22) = 0;
          *(undefined8 *)((long)&local_248.refcount + lVar22) = 0;
          *(undefined8 *)((long)&local_248.dims + lVar22) = 0;
          *(undefined8 *)((long)&local_248.h + lVar22) = 0;
          *(undefined4 *)((long)&local_248.c + lVar22) = 0;
          lVar22 = lVar22 + -0x48;
        } while (lVar22 != -0x48);
      }
      (*pLVar14->_vptr_Layer[4])(pLVar14,local_60);
      (local_e0->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
      super__Vector_impl_data._M_start[sVar17] = pLVar14;
      ParamDict::~ParamDict(&local_40);
      if (local_c8.refcount != (int *)0x0) {
        LOCK();
        *local_c8.refcount = *local_c8.refcount + -1;
        UNLOCK();
        if (*local_c8.refcount == 0) {
          if (local_c8.allocator == (Allocator *)0x0) {
            if (local_c8.data != (void *)0x0) {
              free(local_c8.data);
            }
          }
          else {
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      sVar17 = sVar17 + 1;
    } while ((long)sVar17 < (long)(this->super_ConvolutionDepthWise).group);
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_avx::create_group_ops(const Option& opt)
{
    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i = 0; i < (int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g = 0; g < group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g).clone();
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer_cpu(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g); // weight_data_size
        pd.set(8, int8_scale_term);
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[5];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[2] = weight_data_int8_scales_g;
                weights[3] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[4] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[4];
            weights[0] = weight_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[1] = weight_data_int8_scales_g;
                weights[2] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[3] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }

    return 0;
}